

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileWire.cpp
# Opt level: O0

void __thiscall TileWire::setDirection(TileWire *this,Direction direction,bool noAdjacentUpdates)

{
  undefined4 uVar1;
  Board *pBVar2;
  byte in_DL;
  Direction in_ESI;
  Tile *in_RDI;
  State tempState;
  
  if (*(int *)&in_RDI[8].field_0x24 != 3) {
    if (*(int *)&in_RDI[8].field_0x24 == 4) {
      if ((int)in_ESI % 2 == 1) {
        uVar1 = *(undefined4 *)&in_RDI[9]._vptr_Tile;
        *(undefined4 *)&in_RDI[9]._vptr_Tile = *(undefined4 *)((long)&in_RDI[9]._vptr_Tile + 4);
        *(undefined4 *)((long)&in_RDI[9]._vptr_Tile + 4) = uVar1;
        (*in_RDI->_vptr_Tile[8])(in_RDI,0,(ulong)(in_DL & 1));
        pBVar2 = Tile::getBoardPtr(in_RDI);
        pBVar2->changesMade = true;
      }
    }
    else {
      if (*(int *)&in_RDI[8].field_0x24 == 0) {
        in_RDI->_direction = (int)in_ESI % 2;
      }
      else {
        in_RDI->_direction = in_ESI;
      }
      (*in_RDI->_vptr_Tile[8])(in_RDI,0,in_DL & 1);
      pBVar2 = Tile::getBoardPtr(in_RDI);
      pBVar2->changesMade = true;
    }
  }
  return;
}

Assistant:

void TileWire::setDirection(Direction direction, bool noAdjacentUpdates) {
    if (_type != JUNCTION) {
        if (_type != CROSSOVER) {
            if (_type == STRAIGHT) {
                _direction = static_cast<Direction>(direction % 2);
            } else {
                _direction = direction;
            }
            addUpdate(false, noAdjacentUpdates);
            getBoardPtr()->changesMade = true;
        } else if (direction % 2 == 1) {    // If direction odd, assume 1 or 3 rotations were made to the crossover wire.
            State tempState = _state1;
            _state1 = _state2;
            _state2 = tempState;
            addUpdate(false, noAdjacentUpdates);
            getBoardPtr()->changesMade = true;
        }
    }
}